

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Superposition.cpp
# Opt level: O2

bool Inferences::Superposition::checkSuperpositionFromVariable
               (Clause *eqClause,Literal *eqLit,TermList eqLHS)

{
  Term *this;
  bool bVar1;
  ulong uVar2;
  uint i;
  ulong uVar3;
  long lVar4;
  TermList arg;
  TermList local_38;
  
  uVar2 = (ulong)((uint)*(undefined8 *)&eqClause->field_0x38 & 0xfffff);
  for (uVar3 = 0; uVar3 != uVar2; uVar3 = uVar3 + 1) {
    this = &eqClause->_literals[uVar3]->super_Term;
    if (this != &eqLit->super_Term) {
      if (this->_functor == 0) {
        for (lVar4 = 0; (int)lVar4 != -2; lVar4 = lVar4 + -1) {
          local_38._content =
               this->_args[(ulong)(*(uint *)&this->field_0xc & 0xfffffff) + lVar4]._content;
          if ((local_38._content & 3) == 0) {
            bVar1 = Kernel::TermList::containsSubterm(&local_38,eqLHS);
            if (bVar1) goto LAB_0041986a;
          }
        }
      }
      else {
        bVar1 = Kernel::Term::containsSubterm(this,eqLHS);
        if (bVar1) break;
      }
    }
  }
LAB_0041986a:
  return uVar2 <= uVar3;
}

Assistant:

bool Superposition::checkSuperpositionFromVariable(Clause* eqClause, Literal* eqLit, TermList eqLHS)
{
  ASS(eqLHS.isVar());
  //if we should do rewriting, LHS cannot appear inside RHS
  //ASS_REP(!EqHelper::getOtherEqualitySide(eqLit, eqLHS).containsSubterm(eqLHS), eqLit->toString());

  unsigned clen = eqClause->length();
  for(unsigned i=0; i<clen; i++) {
    Literal* lit = (*eqClause)[i];
    if(lit==eqLit) {
      continue;
    }
    if(lit->isEquality()) {
      for(unsigned aIdx=0; aIdx<2; aIdx++) {
	TermList arg = *lit->nthArgument(aIdx);
	if(arg.isTerm() && arg.containsSubterm(eqLHS)) {
	  return false;
	}
      }
    }
    else if(lit->containsSubterm(eqLHS)) {
      return false;
    }
  }

  return true;
}